

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto_test.cc
# Opt level: O0

void __thiscall
upb_test::FuzzTest_DuplicateOneofIndex_Test::~FuzzTest_DuplicateOneofIndex_Test
          (FuzzTest_DuplicateOneofIndex_Test *this)

{
  FuzzTest_DuplicateOneofIndex_Test *this_local;
  
  ~FuzzTest_DuplicateOneofIndex_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(FuzzTest, DuplicateOneofIndex) {
  RoundTripDescriptor(ParseTextProtoOrDie(
      R"pb(file {
             name: "F"
             message_type {
               name: "M"
               oneof_decl { name: "O" }
               field { name: "f1" number: 1 type: TYPE_INT32 oneof_index: 0 }
               field { name: "f2" number: 1 type: TYPE_INT32 oneof_index: 0 }
             }
           })pb"));
}